

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError Pm_OpenOutput(PortMidiStream **stream,PmDeviceID outputDevice,void *outputDriverInfo,
                     int32_t bufferSize,PmTimeProcPtr time_proc,void *time_info,int32_t latency)

{
  int iVar1;
  PmDeviceID *ptr;
  PmError local_44;
  PmError err;
  PmInternal *midi;
  void *time_info_local;
  PmTimeProcPtr time_proc_local;
  int32_t bufferSize_local;
  void *outputDriverInfo_local;
  PmDeviceID outputDevice_local;
  PortMidiStream **stream_local;
  
  local_44 = pmNoData;
  pm_hosterror = 0;
  *stream = (PortMidiStream *)0x0;
  if ((outputDevice < 0) || (pm_descriptor_index <= outputDevice)) {
    local_44 = pmInvalidDeviceId;
  }
  else if (descriptors[outputDevice].pub.output == 0) {
    local_44 = pmInvalidDeviceId;
  }
  else if (descriptors[outputDevice].pub.opened != 0) {
    local_44 = pmInvalidDeviceId;
  }
  if (local_44 == pmNoData) {
    ptr = (PmDeviceID *)pm_alloc(0x78);
    *stream = ptr;
    if (ptr == (PmDeviceID *)0x0) {
      local_44 = pmInsufficientMemory;
    }
    else {
      *ptr = outputDevice;
      *(undefined2 *)(ptr + 1) = 1;
      *(PmTimeProcPtr *)(ptr + 2) = time_proc;
      if ((time_proc == (PmTimeProcPtr)0x0) && (latency != 0)) {
        iVar1 = Pt_Started();
        if (iVar1 == 0) {
          Pt_Start(1,(PtCallback *)0x0,(void *)0x0);
        }
        *(code **)(ptr + 2) = Pt_Time;
      }
      *(void **)(ptr + 4) = time_info;
      ptr[6] = bufferSize;
      ptr[8] = 0;
      ptr[9] = 0;
      if (latency < 0) {
        latency = 0;
      }
      ptr[10] = latency;
      ptr[0xb] = 0;
      ptr[0xc] = 0;
      ptr[0xd] = 0;
      ptr[0xe] = 0;
      ptr[0xf] = 0xffff;
      ptr[0x11] = 0;
      ptr[0x13] = 1;
      *(pm_fns_type *)(ptr + 0x14) = descriptors[outputDevice].dictionary;
      ptr[0x18] = 0;
      ptr[0x19] = 0;
      ptr[0x1a] = 0;
      ptr[0x1b] = 0;
      ptr[0x1c] = 0;
      descriptors[outputDevice].internalDescriptor = ptr;
      local_44 = (**(code **)(*(long *)(ptr + 0x14) + 0x38))(ptr,outputDriverInfo);
      if (local_44 == pmNoData) {
        descriptors[outputDevice].pub.opened = 1;
      }
      else {
        *stream = (PortMidiStream *)0x0;
        descriptors[outputDevice].internalDescriptor = (void *)0x0;
        pm_free(ptr);
      }
    }
  }
  return local_44;
}

Assistant:

PMEXPORT PmError Pm_OpenOutput(PortMidiStream** stream,
                      PmDeviceID outputDevice,
                      void *outputDriverInfo,
                      int32_t bufferSize,
                      PmTimeProcPtr time_proc,
                      void *time_info,
                      int32_t latency ) 
{
    PmInternal *midi;
    PmError err = pmNoError;
    pm_hosterror = FALSE;
    *stream =  NULL;
    
    /* arg checking */
    if (outputDevice < 0 || outputDevice >= pm_descriptor_index)
        err = pmInvalidDeviceId;
    else if (!descriptors[outputDevice].pub.output) 
        err = pmInvalidDeviceId;
    else if (descriptors[outputDevice].pub.opened)
        err = pmInvalidDeviceId;
    if (err != pmNoError) 
        goto error_return;

    /* create portMidi internal data */
    midi = (PmInternal *) pm_alloc(sizeof(PmInternal)); 
    *stream = midi;                 
    if (!midi) {
        err = pmInsufficientMemory;
        goto error_return;
    }
    midi->device_id = outputDevice;
    midi->write_flag = TRUE;
    midi->time_proc = time_proc;
    /* if latency > 0, we need a time reference. If none is provided,
       use PortTime library */
    if (time_proc == NULL && latency != 0) {
        if (!Pt_Started()) 
            Pt_Start(1, 0, 0);
        /* time_get does not take a parameter, so coerce */
        midi->time_proc = (PmTimeProcPtr) Pt_Time;
    }
    midi->time_info = time_info;
    midi->buffer_len = bufferSize;
    midi->queue = NULL; /* unused by output */
    /* if latency zero, output immediate (timestamps ignored) */
    /* if latency < 0, use 0 but don't return an error */
    if (latency < 0) latency = 0;
    midi->latency = latency;
    midi->sysex_in_progress = FALSE;
    midi->sysex_message = 0; /* unused by output */
    midi->sysex_message_count = 0; /* unused by output */
    midi->filters = 0; /* not used for output */
    midi->channel_mask = 0xFFFF;
    midi->sync_time = 0;
    midi->first_message = TRUE;
    midi->dictionary = descriptors[outputDevice].dictionary;
    midi->fill_base = NULL;
    midi->fill_offset_ptr = NULL;
    midi->fill_length = 0;
    descriptors[outputDevice].internalDescriptor = midi;
    /* open system dependent output device */
    err = (*midi->dictionary->open)(midi, outputDriverInfo);
    if (err) {
        *stream = NULL;
        descriptors[outputDevice].internalDescriptor = NULL;
        /* free portMidi data */
        pm_free(midi); 
    } else {
        /* portMidi input open successful */
        descriptors[outputDevice].pub.opened = TRUE;
    }
error_return:
    /* note: system-dependent code must set pm_hosterror and
     * pm_hosterror_text if a pmHostError occurs
     */
    return pm_errmsg(err);
}